

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_Choice.H
# Opt level: O0

void Fl_Input_Choice::menu_cb(Fl_Widget *param_1,void *data)

{
  Fl_Input_ *this;
  int iVar1;
  Fl_When FVar2;
  Fl_Menu_ *this_00;
  Fl_Menu_Item *pFVar3;
  char *pcVar4;
  char *__s2;
  Fl_Callback_p pFVar5;
  Fl_Menu_Item *item;
  Fl_Widget_Tracker wp;
  Fl_Input_Choice *o;
  void *data_local;
  Fl_Widget *param_0_local;
  
  wp.wp_ = (Fl_Widget *)data;
  Fl_Widget_Tracker::Fl_Widget_Tracker((Fl_Widget_Tracker *)&item,(Fl_Widget *)data);
  this_00 = &menubutton((Fl_Input_Choice *)wp.wp_)->super_Fl_Menu_;
  pFVar3 = Fl_Menu_::mvalue(this_00);
  if ((pFVar3 == (Fl_Menu_Item *)0x0) || ((pFVar3->flags & 0x60U) == 0)) {
    pcVar4 = Fl_Input_::value(*(Fl_Input_ **)&wp.wp_[1].w_);
    __s2 = Fl_Menu_::text((Fl_Menu_ *)wp.wp_[1].label_.value);
    iVar1 = strcmp(pcVar4,__s2);
    if (iVar1 == 0) {
      Fl_Widget::clear_changed(wp.wp_);
      FVar2 = Fl_Widget::when(wp.wp_);
      if ((FVar2 & FL_WHEN_NOT_CHANGED) != FL_WHEN_NEVER) {
        Fl_Widget::do_callback(wp.wp_);
      }
    }
    else {
      this = *(Fl_Input_ **)&wp.wp_[1].w_;
      pcVar4 = Fl_Menu_::text((Fl_Menu_ *)wp.wp_[1].label_.value);
      Fl_Input_::value(this,pcVar4);
      Fl_Widget::set_changed(*(Fl_Widget **)&wp.wp_[1].w_);
      Fl_Widget::set_changed(wp.wp_);
      FVar2 = Fl_Widget::when(wp.wp_);
      if ((FVar2 & (FL_WHEN_RELEASE|FL_WHEN_CHANGED)) != FL_WHEN_NEVER) {
        Fl_Widget::do_callback(wp.wp_);
      }
    }
    iVar1 = Fl_Widget_Tracker::deleted((Fl_Widget_Tracker *)&item);
    if ((iVar1 == 0) &&
       (pFVar5 = Fl_Widget::callback(wp.wp_), pFVar5 != Fl_Widget::default_callback)) {
      Fl_Widget::clear_changed(wp.wp_);
      Fl_Widget::clear_changed(*(Fl_Widget **)&wp.wp_[1].w_);
    }
  }
  Fl_Widget_Tracker::~Fl_Widget_Tracker((Fl_Widget_Tracker *)&item);
  return;
}

Assistant:

static void menu_cb(Fl_Widget*, void *data) { 
    Fl_Input_Choice *o=(Fl_Input_Choice *)data;
    Fl_Widget_Tracker wp(o);
    const Fl_Menu_Item *item = o->menubutton()->mvalue();
    if (item && item->flags & (FL_SUBMENU|FL_SUBMENU_POINTER)) return;	// ignore submenus
    if (!strcmp(o->inp_->value(), o->menu_->text()))
    {
      o->Fl_Widget::clear_changed();
      if (o->when() & FL_WHEN_NOT_CHANGED)
	o->do_callback();
    }
    else
    {
      o->inp_->value(o->menu_->text());
      o->inp_->set_changed();
      o->Fl_Widget::set_changed();
      if (o->when() & (FL_WHEN_CHANGED|FL_WHEN_RELEASE))
	o->do_callback();
    }
    
    if (wp.deleted()) return;

    if (o->callback() != default_callback)
    {
      o->Fl_Widget::clear_changed();
      o->inp_->clear_changed();
    }
  }